

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.h
# Opt level: O2

size_t __thiscall
threadsafe::ring_buffer<sig::ProtoSignal<void_()>::Link>::size
          (ring_buffer<sig::ProtoSignal<void_()>::Link> *this)

{
  undefined8 uVar1;
  size_t sVar2;
  const_iterator it;
  undefined1 local_38 [16];
  
  begin((ring_buffer<sig::ProtoSignal<void_()>::Link> *)local_38);
  sVar2 = 0;
  while( true ) {
    local_38._8_8_ = 0;
    impl::Node<sig::ProtoSignal<void_()>::Link>::inc_ref(&this->root_);
    uVar1 = local_38._0_8_;
    local_38._8_8_ = this;
    impl::Iterator<sig::ProtoSignal<void_()>::Link,_true>::~Iterator
              ((Iterator<sig::ProtoSignal<void_()>::Link,_true> *)(local_38 + 8));
    if ((ring_buffer<sig::ProtoSignal<void_()>::Link> *)uVar1 == this) break;
    sVar2 = sVar2 + 1;
    impl::Iterator<sig::ProtoSignal<void_()>::Link,_true>::operator++
              ((Iterator<sig::ProtoSignal<void_()>::Link,_true> *)local_38);
  }
  impl::Iterator<sig::ProtoSignal<void_()>::Link,_true>::~Iterator
            ((Iterator<sig::ProtoSignal<void_()>::Link,_true> *)local_38);
  return sVar2;
}

Assistant:

size_t size() const {
        size_t i = 0;
        for(auto it = begin(); it != end(); ++it) {
            ++i;
        }
        return i;
    }